

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O0

void __thiscall
TEST_MockComparatorCopierTest_customTypeOutputParameterTraced_Test::testBody
          (TEST_MockComparatorCopierTest_customTypeOutputParameterTraced_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  UtestShell *pUVar3;
  char *pcVar4;
  SimpleString local_d8;
  SimpleString local_c8;
  SimpleString local_b8;
  SimpleString local_a8;
  SimpleString local_98;
  SimpleString local_88;
  SimpleString local_78;
  SimpleString local_68;
  SimpleString local_58;
  SimpleString local_48 [2];
  MyTypeForTestingCopier local_28;
  MyTypeForTestingCopier copier;
  MyTypeForTesting actualObject;
  TEST_MockComparatorCopierTest_customTypeOutputParameterTraced_Test *this_local;
  
  MyTypeForTesting::MyTypeForTesting((MyTypeForTesting *)&copier,0xa53b5);
  MyTypeForTestingCopier::MyTypeForTestingCopier(&local_28);
  SimpleString::SimpleString(local_48,"");
  pMVar2 = mock(local_48,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_58,"MyTypeForTesting");
  (*pMVar2->_vptr_MockSupport[0x2d])(pMVar2,&local_58,&local_28);
  SimpleString::~SimpleString(&local_58);
  SimpleString::~SimpleString(local_48);
  SimpleString::SimpleString(&local_68,"");
  pMVar2 = mock(&local_68,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x23])(pMVar2,1);
  SimpleString::~SimpleString(&local_68);
  SimpleString::SimpleString(&local_78,"");
  pMVar2 = mock(&local_78,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_88,"someFunc");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_88);
  SimpleString::SimpleString(&local_98,"MyTypeForTesting");
  SimpleString::SimpleString(&local_a8,"someParameter");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x30))
            ((long *)CONCAT44(extraout_var,iVar1),&local_98,&local_a8,&copier);
  SimpleString::~SimpleString(&local_a8);
  SimpleString::~SimpleString(&local_98);
  SimpleString::~SimpleString(&local_88);
  SimpleString::~SimpleString(&local_78);
  SimpleString::SimpleString(&local_b8,"");
  pMVar2 = mock(&local_b8,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])();
  SimpleString::~SimpleString(&local_b8);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_c8,"");
  pMVar2 = mock(&local_c8,(MockFailureReporter *)0x0);
  pcVar4 = MockSupport::getTraceOutput(pMVar2);
  (*pUVar3->_vptr_UtestShell[0xc])
            (pUVar3,"Function name:someFunc MyTypeForTesting someParameter:",pcVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
             ,0x1bb);
  SimpleString::~SimpleString(&local_c8);
  SimpleString::SimpleString(&local_d8,"");
  pMVar2 = mock(&local_d8,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x2f])();
  SimpleString::~SimpleString(&local_d8);
  MyTypeForTestingCopier::~MyTypeForTestingCopier(&local_28);
  MyTypeForTesting::~MyTypeForTesting((MyTypeForTesting *)&copier);
  return;
}

Assistant:

TEST(MockComparatorCopierTest, customTypeOutputParameterTraced)
{
    MyTypeForTesting actualObject(676789);
    MyTypeForTestingCopier copier;
    mock().installCopier("MyTypeForTesting", copier);
    mock().tracing(true);

    mock().actualCall("someFunc").withOutputParameterOfType("MyTypeForTesting", "someParameter", &actualObject);

    mock().checkExpectations();
    STRCMP_CONTAINS("Function name:someFunc MyTypeForTesting someParameter:", mock().getTraceOutput());

    mock().removeAllComparatorsAndCopiers();
}